

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcDivide.c
# Opt level: O1

void Mvc_CoverDivideByLiteralQuo(Mvc_Cover_t *pCover,int iLit)

{
  int *piVar1;
  byte bVar2;
  Mvc_Cube_t *pMVar3;
  Mvc_Cube_t *pCube;
  Mvc_Cube_t *pMVar4;
  Mvc_Cube_t *pMVar5;
  
  pCube = (pCover->lCubes).pHead;
  if (pCube != (Mvc_Cube_t *)0x0) {
    bVar2 = (byte)iLit & 0x1f;
    pMVar5 = (Mvc_Cube_t *)0x0;
    pMVar4 = pCube->pNext;
    while( true ) {
      if ((pCube->pData[iLit >> 5] & 1 << ((byte)iLit & 0x1f)) == 0) {
        pMVar3 = pMVar5;
        if (pMVar5 == (Mvc_Cube_t *)0x0) {
          pMVar3 = (Mvc_Cube_t *)&pCover->lCubes;
        }
        pMVar3->pNext = pCube->pNext;
        if ((pCover->lCubes).pTail == pCube) {
          if (pCube->pNext != (Mvc_Cube_t *)0x0) {
            __assert_fail("pCube->pNext == NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/mvc/mvcDivide.c"
                          ,0x180,"void Mvc_CoverDivideByLiteralQuo(Mvc_Cover_t *, int)");
          }
          (pCover->lCubes).pTail = pMVar5;
        }
        piVar1 = &(pCover->lCubes).nItems;
        *piVar1 = *piVar1 + -1;
        Mvc_CubeFree(pCover,pCube);
      }
      else {
        pCube->pData[iLit >> 5] =
             pCube->pData[iLit >> 5] & (-2 << bVar2 | 0xfffffffeU >> 0x20 - bVar2);
        pMVar5 = pCube;
      }
      if (pMVar4 == (Mvc_Cube_t *)0x0) break;
      pCube = pMVar4;
      pMVar4 = pMVar4->pNext;
    }
  }
  return;
}

Assistant:

void Mvc_CoverDivideByLiteralQuo( Mvc_Cover_t * pCover, int iLit )
{
    Mvc_Cube_t * pCube, * pCube2, * pPrev;
    // delete those cubes that do not have this literal
    // remove this literal from other cubes
    pPrev = NULL;
    Mvc_CoverForEachCubeSafe( pCover, pCube, pCube2 )
    {
        if ( Mvc_CubeBitValue( pCube, iLit ) == 0 )
        { // delete the cube from the cover
            Mvc_CoverDeleteCube( pCover, pPrev, pCube );
            Mvc_CubeFree( pCover, pCube );
            // don't update the previous cube
        }
        else
        { // delete this literal from the cube
            Mvc_CubeBitRemove( pCube, iLit );
            // update the previous cube
            pPrev = pCube;
        }
    }
}